

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

Symbol * slang::ast::recurseDefaultIfaceInst
                   (Compilation *comp,InterfacePortSymbol *port,InstanceSymbol **firstInst,
                   iterator it,iterator end)

{
  pointer ppSVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  InstanceArraySymbol *pIVar5;
  undefined4 extraout_var;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ConstantRange range;
  Symbol *symbol;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  ConstantRange local_a0;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_98;
  SmallVectorBase<const_slang::ast::Symbol_*> local_80 [2];
  ConstantRange local_40;
  SourceLocation local_38;
  
  if (it._M_current == end._M_current) {
    pIVar5 = (InstanceArraySymbol *)
             InstanceSymbol::createDefault
                       (comp,port->interfaceDef,(HierarchyOverrideNode *)0x0,
                        (ConfigBlockSymbol *)0x0,(ConfigRule *)0x0,(port->super_Symbol).location);
    if (*firstInst == (InstanceSymbol *)0x0) {
      *firstInst = (InstanceSymbol *)pIVar5;
    }
  }
  else {
    local_a0 = *it._M_current;
    iVar2 = local_a0.left;
    iVar4 = iVar2 - local_a0.right;
    if (iVar2 - local_a0.right == 0 || iVar2 < local_a0.right) {
      iVar4 = -(iVar2 - local_a0.right);
    }
    if ((comp->options).maxInstanceArray < iVar4 + 1U) {
      local_80[0].data_ = (pointer)(port->super_Symbol).name._M_len;
      local_80[0].len = (size_type)(port->super_Symbol).name._M_str;
      local_38 = (port->super_Symbol).location;
      local_98._M_ptr = (pointer)0x0;
      local_98._M_extent._M_extent_value = 0;
      local_40.left = 0;
      local_40.right = 0;
      pIVar5 = BumpAllocator::
               emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>,slang::ConstantRange>
                         (&comp->super_BumpAllocator,comp,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_80,&local_38,
                          &local_98,&local_40);
    }
    else {
      uVar6 = -(iVar2 - local_a0.right);
      local_80[0].data_ = (pointer)local_80[0].firstElement;
      local_80[0].len = 0;
      local_80[0].cap = 5;
      uVar7 = iVar2 - local_a0.right;
      if (iVar2 - local_a0.right == 0 || iVar2 < local_a0.right) {
        uVar7 = uVar6;
      }
      if (uVar7 != 0xffffffff) {
        uVar7 = 0;
        do {
          local_98._M_ptr =
               (pointer)recurseDefaultIfaceInst(comp,port,firstInst,it._M_current + 1,end);
          (((Symbol *)local_98._M_ptr)->name)._M_len = 0;
          (((Symbol *)local_98._M_ptr)->name)._M_str = "";
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)local_80,(Symbol **)&local_98);
          uVar6 = -(local_a0.left - local_a0.right);
          uVar3 = local_a0.left - local_a0.right;
          if (local_a0.left - local_a0.right == 0 || local_a0.left < local_a0.right) {
            uVar3 = uVar6;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar3 + 1);
      }
      iVar4 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                        (local_80,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)(ulong)uVar6);
      local_98._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
      pIVar5 = BumpAllocator::
               emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                         (&comp->super_BumpAllocator,comp,&(port->super_Symbol).name,
                          &(port->super_Symbol).location,
                          (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)&local_98,
                          &local_a0);
      ppSVar1 = local_80[0].data_;
      if (local_80[0].len != 0) {
        lVar9 = local_80[0].len << 3;
        lVar8 = 0;
        do {
          Scope::insertMember(&pIVar5->super_Scope,*(Symbol **)((long)ppSVar1 + lVar8),
                              (pIVar5->super_Scope).lastMember,false,true);
          lVar8 = lVar8 + 8;
        } while (lVar9 != lVar8);
      }
      if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
        operator_delete(local_80[0].data_);
      }
    }
  }
  return &pIVar5->super_Symbol;
}

Assistant:

static Symbol* recurseDefaultIfaceInst(Compilation& comp, const InterfacePortSymbol& port,
                                       const InstanceSymbol*& firstInst,
                                       std::span<const ConstantRange>::iterator it,
                                       std::span<const ConstantRange>::iterator end) {
    if (it == end) {
        auto& result = InstanceSymbol::createDefault(comp, *port.interfaceDef, nullptr, nullptr,
                                                     nullptr, port.location);

        if (!firstInst)
            firstInst = &result;
        return &result;
    }

    ConstantRange range = *it++;
    if (range.width() > comp.getOptions().maxInstanceArray)
        return &InstanceArraySymbol::createEmpty(comp, port.name, port.location);

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        auto symbol = recurseDefaultIfaceInst(comp, port, firstInst, it, end);
        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, port.name, port.location,
                                                    elements.copy(comp), range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}